

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void key_schedule_transform_post_ch1hash(ptls_key_schedule_t *sched)

{
  size_t sVar1;
  long local_88;
  size_t i;
  undefined1 local_78 [4];
  uint8_t prefix [4];
  uint8_t ch1hash [64];
  ptls_hash_context_t *hashes [3];
  size_t digest_size;
  ptls_key_schedule_t *sched_local;
  
  sVar1 = (sched->hashes[0].algo)->digest_size;
  i._4_1_ = 0xfe;
  i._5_1_ = 0;
  i._6_1_ = 0;
  i._7_1_ = (undefined1)sVar1;
  for (local_88 = 0; hashes[local_88 + -1] != (ptls_hash_context_t *)0x0; local_88 = local_88 + 1) {
    (*hashes[local_88 + -1]->final)(hashes[local_88 + -1],local_78,PTLS_HASH_FINAL_MODE_RESET);
    (*hashes[local_88 + -1]->update)(hashes[local_88 + -1],(void *)((long)&i + 4),4);
    (*hashes[local_88 + -1]->update)(hashes[local_88 + -1],local_78,sVar1);
  }
  (*ptls_clear_memory)(local_78,0x40);
  return;
}

Assistant:

static void key_schedule_transform_post_ch1hash(ptls_key_schedule_t *sched)
{
    size_t digest_size = sched->hashes[0].algo->digest_size;
    ptls_hash_context_t *hashes[3] = {sched->hashes[0].ctx, sched->hashes[0].ctx_outer, NULL};
    uint8_t ch1hash[PTLS_MAX_DIGEST_SIZE];
    uint8_t prefix[4] = {PTLS_HANDSHAKE_TYPE_MESSAGE_HASH, 0, 0, (uint8_t)digest_size};

    for (size_t i = 0; hashes[i] != NULL; ++i) {
        hashes[i]->final(hashes[i], ch1hash, PTLS_HASH_FINAL_MODE_RESET);
        hashes[i]->update(hashes[i], prefix, sizeof(prefix));
        hashes[i]->update(hashes[i], ch1hash, digest_size);
    }

    ptls_clear_memory(ch1hash, sizeof(ch1hash));
}